

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int rcholu(double *A,int N,int stride,double *U22)

{
  long lVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  
  if (N != 1) {
    uVar7 = (ulong)(N - 1);
    uVar9 = (ulong)N;
    pdVar6 = A + (stride + 1);
    do {
      dVar10 = *A;
      if (dVar10 < 0.0) {
        return -1;
      }
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      *A = dVar10;
      if ((long)uVar9 < 2) {
        iVar8 = (int)uVar9 + -1;
        mmult(A + 1,A + 1,U22,iVar8,1,iVar8);
      }
      else {
        uVar3 = 1;
        do {
          A[uVar3] = A[uVar3] / dVar10;
          uVar3 = uVar3 + 1;
        } while ((uVar9 & 0xffffffff) != uVar3);
        iVar8 = (int)(uVar9 - 1);
        mmult(A + 1,A + 1,U22,iVar8,1,iVar8);
        if (1 < (long)uVar9) {
          uVar3 = 0;
          pdVar2 = pdVar6;
          pdVar4 = U22;
          do {
            lVar5 = 0;
            do {
              pdVar2[lVar5] = pdVar2[lVar5] - pdVar4[lVar5];
              lVar1 = uVar3 + lVar5;
              lVar5 = lVar5 + 1;
            } while (lVar1 + 1 < (long)(uVar9 - 1));
            uVar3 = uVar3 + 1;
            pdVar4 = pdVar4 + uVar9;
            pdVar2 = pdVar2 + (long)stride + 1;
          } while (uVar3 != uVar7);
        }
      }
      uVar9 = uVar9 - 1;
      A = A + (long)stride + 1;
      uVar7 = uVar7 - 1;
      pdVar6 = pdVar6 + (long)stride + 1;
    } while (uVar9 != 1);
  }
  dVar10 = *A;
  iVar8 = -1;
  if (0.0 < dVar10) {
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    *A = dVar10;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int rcholu(double *A,int N, int stride, double *U22) {
	int sc;
	int j,i,u,w;
	double u11;
	
	if (N == 1) {
		if (A[0] > 0) {
			A[0] = sqrt(A[0]);
			return 0;
		} else {
			return -1;
		}
	} else {
		if (A[0] < 0) {
			return -1;
		}
		u11 = sqrt(A[0]);
		A[0] = u11;
		for (j = 1; j < N;++j) {
			A[j] /= u11;
		}
		mmult(A+1,A+1,U22,N-1,1,N-1);
		for (i = 0; i < N-1; ++i) {
			u = stride + 1+ i * stride;
			w = i * (N-1);
			for(j = i; j < N-1;j++) {
				A[j + u] -= U22[j + w];
			}
		}
		
		sc = rcholu(A+stride+1,N-1,stride,U22);
		if (sc == -1) {
			return -1;
		}
		
	}
	
	return sc;
	
}